

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionResult::AssertionResult(AssertionResult *this)

{
  AssertionInfo::AssertionInfo(&this->m_info);
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_resultData).reconstructedExpression.field_2;
  (this->m_resultData).reconstructedExpression._M_string_length = 0;
  (this->m_resultData).reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_resultData).message._M_dataplus._M_p = (pointer)&(this->m_resultData).message.field_2;
  (this->m_resultData).message._M_string_length = 0;
  (this->m_resultData).message.field_2._M_local_buf[0] = '\0';
  (this->m_resultData).resultType = Unknown;
  return;
}

Assistant:

AssertionResult::AssertionResult() {}